

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb_main.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  int __fd;
  int iVar6;
  char *extraout_RAX;
  long lVar7;
  size_t sVar8;
  FILE *pFVar9;
  FILE *__stream;
  char *pcVar10;
  char *pcVar11;
  __off_t _Var12;
  ssize_t sVar13;
  ulong *unaff_RBX;
  ulong *puVar14;
  libdir *plVar15;
  int unaff_EBP;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  ulong *unaff_R13;
  size_t sVar19;
  library *plVar20;
  ulong uVar21;
  char unaff_R15B;
  long lVar22;
  ulong uVar23;
  library lib;
  char buf [8192];
  long local_3fc0;
  int local_3fb4;
  int local_3fa8;
  ulong *local_3f98;
  library local_3f78 [142];
  char local_2039 [8201];
  
  pcVar16 = (char *)(ulong)(uint)argc;
  if (((0 < argc) && (pcVar10 = *argv, pcVar10 != (char *)0x0)) && (*pcVar10 != '\0')) {
    progname = pcVar10;
  }
  if (1 < argc) {
    local_3f98 = (ulong *)(ulong)(uint)argc;
    unaff_EBP = 2;
    unaff_R15B = ' ';
    lVar22 = 0;
    bVar2 = false;
    local_3fb4 = 0;
    unaff_RBX = (ulong *)0x0;
    do {
      bVar1 = argv[1][lVar22];
      iVar5 = (int)unaff_RBX;
      iVar4 = unaff_EBP;
      local_3fa8 = argc;
      if (bVar1 < 0x66) {
        if (bVar1 < 0x43) {
          if (bVar1 != 0x2d) goto LAB_00102437;
        }
        else {
          if (bVar1 == 0x43) {
            if (argc == unaff_EBP) break;
            iVar4 = chdir(argv[unaff_EBP]);
            if (iVar4 != 0) {
              pFVar9 = (FILE *)argv[unaff_EBP];
              pcVar16 = "Can\'t chdir to %s\n";
              goto LAB_0010267f;
            }
          }
          else {
            if (bVar1 != 0x49) {
              if (bVar1 == 99) goto LAB_0010237b;
              break;
            }
            if (argc == unaff_EBP) break;
            list_file = argv[unaff_EBP];
            unaff_RBX = (ulong *)0x1;
            iVar4 = unaff_EBP + 1;
            if (iVar5 == 0) goto LAB_001023d4;
            puts("Warning: multiple I options.  Previous ignored.");
          }
          iVar4 = unaff_EBP + 1;
        }
      }
      else if (bVar1 < 0x76) {
        if (bVar1 == 0x66) {
          if (argc == unaff_EBP) break;
          library_file = argv[unaff_EBP];
          if (bVar2) {
            puts("Warning: multiple f options.  Previous ignored.");
          }
          bVar2 = true;
          iVar4 = unaff_EBP + 1;
        }
        else {
          if (bVar1 != 0x74) {
            if (bVar1 != 0x68) break;
            goto LAB_00102482;
          }
LAB_0010237b:
          if (unaff_R15B != ' ') {
            iVar4 = 0x10438e;
            puts("Only one of t,x,c may be specified.");
            usage();
            goto LAB_00102453;
          }
          unaff_R15B = argv[1][lVar22];
        }
      }
      else {
        if (bVar1 != 0x76) {
          if (bVar1 == 0x78) goto LAB_0010237b;
          break;
        }
        local_3fb4 = 1;
      }
LAB_001023d4:
      unaff_EBP = iVar4;
      lVar22 = lVar22 + 1;
      unaff_R13 = unaff_RBX;
    } while( true );
  }
LAB_001024a1:
  iVar5 = (int)unaff_RBX;
  iVar4 = (int)pcVar16;
  usage();
  pcVar16 = extraout_RAX;
LAB_001024a6:
  if (unaff_R15B == 'c') {
    uVar23 = 0;
    if ((iVar4 - unaff_EBP != 0 && unaff_EBP <= iVar4) && pcVar16 != (char *)0x0) {
      plVar20 = local_3f78;
      uVar23 = 0;
      do {
        if (uVar23 == 0xfa) goto LAB_0010288a;
        pcVar16 = argv[(long)unaff_EBP + uVar23];
        sVar8 = strlen(pcVar16);
        pFVar9 = (FILE *)malloc(sVar8 + 1);
        plVar20->fdata = pFVar9;
        strcpy((char *)pFVar9,pcVar16);
        uVar23 = uVar23 + 1;
        plVar20 = (library *)&plVar20->nentries;
      } while ((uint)(iVar4 - unaff_EBP) != uVar23);
    }
    if (iVar5 == 0) {
LAB_00102879:
      iVar4 = (int)uVar23;
      if (iVar4 == 0) {
        pcVar16 = "No files to archive";
        goto LAB_00102473;
      }
      if (iVar4 < 1) {
        lVar22 = 0;
        local_3fc0 = 0;
      }
      else {
        lVar17 = 0;
        local_3fc0 = 0;
        lVar22 = 0;
        do {
          pFVar9 = *(FILE **)((long)&local_3f78[0].fdata + lVar17);
          iVar5 = open((char *)pFVar9,0,0);
          if (iVar5 < 0) {
            pcVar16 = "Can\'t open %s\n";
            goto LAB_0010267f;
          }
          _Var12 = lseek(iVar5,0,2);
          *(__off_t *)((long)&local_3f78[0].dir + lVar17) = _Var12;
          *(long *)((long)&local_3f78[0].fmark + lVar17) = local_3fc0;
          sVar8 = strlen((char *)pFVar9);
          lVar22 = lVar22 + sVar8;
          local_3fc0 = local_3fc0 + _Var12;
          close(iVar5);
          lVar17 = lVar17 + 0x20;
        } while ((uVar23 & 0xffffffff) << 5 != lVar17);
      }
      iVar5 = open(library_file,0x242,0x1b0);
      if (-1 < iVar5) {
        lVar17 = iVar4 * 0xb + lVar22 + 0x3c;
        write_dlb_directory(iVar5,iVar4,(libdir *)local_3f78,lVar22,lVar17,local_3fc0);
        if (iVar4 < 1) {
          bVar2 = true;
          local_3fc0 = 0;
        }
        else {
          bVar2 = false;
          uVar18 = 0;
          local_3fc0 = 0;
          do {
            pFVar9 = (&local_3f78[0].fdata)[uVar18 * 4];
            __fd = open((char *)pFVar9,0,0);
            if (__fd < 0) {
              pcVar16 = "Can\'t open input file \'%s\'\n";
              goto LAB_0010267f;
            }
            if (local_3fb4 != 0) {
              puts((char *)pFVar9);
            }
            plVar15 = (libdir *)0x0;
            while( true ) {
              sVar13 = read(__fd,local_2039 + 1,0x2000);
              iVar6 = (int)sVar13;
              if (iVar6 == 0) break;
              if (iVar6 == -1) {
                pcVar16 = "Read Error in \'%s\'\n";
                goto LAB_0010267f;
              }
              sVar19 = (size_t)iVar6;
              sVar8 = write(iVar5,local_2039 + 1,sVar19);
              plVar15 = (libdir *)((long)&plVar15->fname + sVar19);
              if (sVar8 != sVar19) {
                pcVar16 = "Write Error in \'%s\'\n";
                goto LAB_0010267f;
              }
            }
            close(__fd);
            if (plVar15 != (&local_3f78[0].dir)[uVar18 * 4]) {
              bVar2 = true;
            }
            (&local_3f78[0].dir)[uVar18 * 4] = plVar15;
            (&local_3f78[0].fmark)[uVar18 * 4] = local_3fc0;
            local_3fc0 = (long)&plVar15->fname + local_3fc0;
            uVar18 = uVar18 + 1;
          } while (uVar18 != (uVar23 & 0xffffffff));
          bVar2 = !bVar2;
        }
        if (!bVar2) {
          if (local_3fb4 != 0) {
            puts("(rewriting dlb directory info)");
          }
          lseek(iVar5,0,0);
          write_dlb_directory(iVar5,iVar4,(libdir *)local_3f78,lVar22,lVar17,local_3fc0);
        }
        if (0 < iVar4) {
          lVar22 = 0;
          do {
            free(*(void **)((long)&local_3f78[0].fdata + lVar22));
            *(undefined8 *)((long)&local_3f78[0].fdata + lVar22) = 0;
            lVar22 = lVar22 + 0x20;
          } while ((uVar23 & 0xffffffff) << 5 != lVar22);
        }
        close(iVar5);
LAB_001027de:
        exit(0);
      }
      pcVar16 = "Can\'t open %s for output\n";
      pFVar9 = (FILE *)library_file;
    }
    else {
      __stream = fopen(list_file,"r");
      if (__stream != (FILE *)0x0) {
        pcVar16 = local_2039 + 1;
        pcVar10 = fgets(pcVar16,0x2000,__stream);
        if (pcVar10 != (char *)0x0) {
          uVar18 = uVar23 & 0xffffffff;
          uVar21 = 0xfa;
          if (0xfa < (uint)uVar23) {
            uVar21 = uVar23 & 0xffffffff;
          }
          do {
            pcVar10 = pcVar16;
            if (uVar18 == uVar21) goto LAB_0010288a;
            do {
              pcVar11 = pcVar10;
              pcVar10 = pcVar11 + 1;
            } while (*pcVar11 != '\0');
            pcVar11[-1] = '\0';
            sVar8 = strlen(pcVar16);
            pFVar9 = (FILE *)malloc(sVar8 + 1);
            (&local_3f78[0].fdata)[uVar18 * 4] = pFVar9;
            strcpy((char *)pFVar9,pcVar16);
            uVar18 = uVar18 + 1;
            pcVar10 = fgets(pcVar16,0x2000,__stream);
          } while (pcVar10 != (char *)0x0);
          uVar23 = uVar18 & 0xffffffff;
        }
        fclose(__stream);
        goto LAB_00102879;
      }
      pcVar16 = "Can\'t open %s\n";
      pFVar9 = (FILE *)list_file;
    }
LAB_0010267f:
    printf(pcVar16,pFVar9);
  }
  else {
    if (unaff_R15B == 't') {
      bVar3 = open_library(library_file,local_3f78);
      if (bVar3 != '\0') {
        if (0 < local_3f78[0].nentries) {
          lVar22 = 0;
          lVar17 = 0;
          do {
            if (local_3fb4 == 0) {
              puts(*(char **)((long)&(local_3f78[0].dir)->fname + lVar22));
            }
            else {
              printf("%-14s %6ld %6ld\n",*(undefined8 *)((long)&(local_3f78[0].dir)->fname + lVar22)
                     ,*(undefined8 *)((long)&(local_3f78[0].dir)->foffset + lVar22),
                     *(undefined8 *)((long)&(local_3f78[0].dir)->fsize + lVar22));
            }
            lVar17 = lVar17 + 1;
            lVar22 = lVar22 + 0x20;
          } while (lVar17 < local_3f78[0].nentries);
        }
        if (local_3fb4 != 0) {
          printf("Revision:%ld  File count:%ld  String size:%ld\n",local_3f78[0].rev,
                 local_3f78[0].nentries,local_3f78[0].strsize);
        }
        goto LAB_001027d4;
      }
LAB_00102740:
      pcVar16 = "Can\'t open dlb file";
    }
    else {
      if (unaff_R15B == 'x') {
        bVar3 = open_library(library_file,local_3f78);
        if (bVar3 == '\0') goto LAB_00102740;
        if (0 < local_3f78[0].nentries) {
          lVar22 = 0;
          do {
            if (argv[(long)unaff_R13] == (char *)0x0) {
              iVar4 = strcmp(local_3f78[0].dir[lVar22].fname,"Directory");
              if (iVar4 != 0) goto LAB_00102574;
            }
            else {
              iVar4 = unaff_EBP;
              if (unaff_EBP < local_3fa8) {
                pcVar16 = local_3f78[0].dir[lVar22].fname;
                puVar14 = unaff_R13;
                do {
                  iVar4 = strcmp(pcVar16,argv[(long)puVar14]);
                  if (iVar4 == 0) goto LAB_0010253d;
                  puVar14 = (ulong *)((long)puVar14 + 1);
                } while (local_3f98 != puVar14);
                puVar14 = (ulong *)((ulong)local_3f98 & 0xffffffff);
LAB_0010253d:
                iVar4 = (int)puVar14;
              }
              if (iVar4 != local_3fa8) {
LAB_00102574:
                fseek((FILE *)local_3f78[0].fdata,local_3f78[0].dir[lVar22].foffset,0);
                iVar4 = open(local_3f78[0].dir[lVar22].fname,0x241,0x1a0);
                if (iVar4 < 0) {
                  pcVar16 = "Can\'t create \'%s\'\n";
                  pFVar9 = (FILE *)local_3f78[0].dir[lVar22].fname;
                  goto LAB_0010267f;
                }
                lVar17 = 0;
                do {
                  lVar7 = local_3f78[0].dir[lVar22].fsize - lVar17;
                  if (0x1fff < lVar7) {
                    lVar7 = 0x2000;
                  }
                  sVar8 = fread(local_2039 + 1,1,(long)(int)lVar7,(FILE *)local_3f78[0].fdata);
                  if ((int)lVar7 != (int)sVar8) {
                    pcVar16 = "Read Error in \'%s\'\n";
                    pFVar9 = (FILE *)local_3f78[0].dir[lVar22].fname;
                    goto LAB_0010267f;
                  }
                  sVar19 = (size_t)(int)sVar8;
                  sVar8 = write(iVar4,local_2039 + 1,sVar19);
                  if (sVar8 != sVar19) {
                    pcVar16 = "Write Error in \'%s\'\n";
                    pFVar9 = (FILE *)local_3f78[0].dir[lVar22].fname;
                    goto LAB_0010267f;
                  }
                  lVar17 = lVar17 + sVar19;
                } while (lVar17 != local_3f78[0].dir[lVar22].fsize);
                close(iVar4);
                if (local_3fb4 != 0) {
                  printf("x %s\n",local_3f78[0].dir[lVar22].fname);
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < local_3f78[0].nentries);
        }
LAB_001027d4:
        close_library(local_3f78);
        goto LAB_001027de;
      }
      pcVar16 = "Internal error - action.";
    }
LAB_00102473:
    puts(pcVar16);
  }
LAB_00102686:
  exit(1);
LAB_00102437:
  iVar4 = argc;
  if (bVar1 != 0) {
    if (bVar1 == 0x3f) {
LAB_00102482:
      pcVar16 = "";
      unaff_RBX = (ulong *)(verbose_help_long_help + 8);
      do {
        puts(pcVar16);
        pcVar16 = (char *)*unaff_RBX;
        unaff_RBX = unaff_RBX + 1;
      } while (pcVar16 != (char *)0x0);
    }
    goto LAB_001024a1;
  }
LAB_00102453:
  unaff_R13 = (ulong *)(long)unaff_EBP;
  pcVar16 = argv[(long)unaff_R13];
  if (iVar5 == 0 || pcVar16 == (char *)0x0) goto LAB_001024a6;
  pcVar16 = "Too many arguments.";
  goto LAB_00102473;
LAB_0010288a:
  printf("Too many dlb files!  Stopping at %d.\n",0xfa);
  goto LAB_00102686;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, r;
    int ap=2;				/* argument pointer */
    int cp;				/* command pointer */
    int iseen=0, fseen=0, verbose=0;	/* flags */
    char action=' ';
    library lib;

    if (argc > 0 && argv[0] && *argv[0]) progname = argv[0];

    if (argc<2) {
	usage();
	/* doesn't return */
    }

    for (cp=0; argv[1][cp]; cp++){
	switch(argv[1][cp]){
	    default:
		usage();	/* doesn't return */
	    case '-':	/* silently ignore */
		break;
	    case '?':
	    case 'h':
		verbose_help();
		break;
	    case 'I':
		if (ap == argc) usage();
		list_file=argv[ap++];
		if (iseen)
		    printf("Warning: multiple I options.  Previous ignored.\n");
		iseen=1;
		break;
	    case 'f':
		if (ap == argc) usage();
		library_file=argv[ap++];
		if (fseen)
		    printf("Warning: multiple f options.  Previous ignored.\n");
		fseen=1;
		break;
	    case 'C':
		if (ap == argc) usage();
		if (chdir(argv[ap++])){
		    printf("Can't chdir to %s\n",argv[--ap]);
		    xexit(EXIT_FAILURE);
		}
		break;
	    case 'v':
		verbose=1;
		break;
	    case 't':
	    case 'c':
	    case 'x':
		if (action != ' '){
		    printf("Only one of t,x,c may be specified.\n");
		    usage();
		}
		action=argv[1][cp];
		break;
	}
    }

    if (argv[ap] && iseen){
	printf("Too many arguments.\n");
	xexit(EXIT_FAILURE);
    }

    switch(action){
    default:
	printf("Internal error - action.\n");
	xexit(EXIT_FAILURE);
	break;
    case 't':			/* list archive */
	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (verbose)
		printf("%-14s %6ld %6ld\n",
		    lib.dir[i].fname, lib.dir[i].foffset, lib.dir[i].fsize);
	    else
		printf("%s\n", lib.dir[i].fname);
	}

	if (verbose)
	    printf("Revision:%ld  File count:%ld  String size:%ld\n",
		lib.rev, lib.nentries, lib.strsize);

	close_library(&lib);
	xexit(EXIT_SUCCESS);

    case 'x': {			/* extract archive contents */
	int f, n;
	long remainder, total_read;
	char buf[BUFSIZ];

	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (argv[ap]) {
		/* if files are listed, see if current is wanted */
		int c;
		for (c = ap; c < argc; c++)
		    if (!FILENAME_CMP(lib.dir[i].fname, argv[c])) break;
		if (c == argc) continue;	/* skip */
	    } else if (!FILENAME_CMP(lib.dir[i].fname, DLB_DIRECTORY)) {
		/*
		 * Don't extract the directory unless the user
		 * specifically asks for it.
		 *
		 * Perhaps we should never extract the directory???
		 */
		continue;
	    }
	    fseek(lib.fdata, lib.dir[i].foffset, SEEK_SET);

	    f = open(lib.dir[i].fname, O_WRONLY|O_TRUNC|O_BINARY|O_CREAT, 0640);
	    if (f < 0) {
		printf("Can't create '%s'\n", lib.dir[i].fname);
		xexit(EXIT_FAILURE);
	    }

	    /* read chunks from library and write them out */
	    total_read = 0;
	    do {
		remainder = lib.dir[i].fsize - total_read;
		if (remainder > (long) sizeof(buf))
		    r = (int) sizeof(buf);
		else
		    r = remainder;

		n = fread(buf, 1, r, lib.fdata);
		if (n != r) {
		    printf("Read Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(f, buf, n) != n) {
		    printf("Write Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}

		total_read += n;
	    } while (total_read != lib.dir[i].fsize);

	    close(f);

	    if (verbose) printf("x %s\n", lib.dir[i].fname);
	}

	close_library(&lib);
	xexit(EXIT_SUCCESS);
	}

    case 'c':			/* create archive */
	{
	libdir ld[MAX_DLB_FILES];
	char buf[BUFSIZ];
	int fd, out, nfiles = 0;
	long dir_size, slen, flen, fsiz;
	boolean rewrite_directory = FALSE;

	/*
	 * Get names from either/both an argv list and a file
	 * list.  This does not do any duplicate checking
	 */

	/* get file name in argv list */
	if (argv[ap]) {
	    for ( ; ap < argc; ap++, nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		ld[nfiles].fname = malloc(strlen(argv[ap]) + 1);
		strcpy(ld[nfiles].fname, argv[ap]);
	    }
	}

	if (iseen) {
	    /* want to do a list file */
	    FILE *list = fopen(list_file, "r");
	    if (!list) {
		printf("Can't open %s\n",list_file);
		xexit(EXIT_FAILURE);
	    }

	    /* get file names, one per line */
	    for ( ; fgets(buf, sizeof(buf), list); nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		*(eos(buf)-1) = '\0';	/* strip newline */
		ld[nfiles].fname = malloc(strlen(buf) + 1);
		strcpy(ld[nfiles].fname, buf);
	    }
	    fclose(list);
	}

	if (nfiles == 0) {
	    printf("No files to archive\n");
	    xexit(EXIT_FAILURE);
	}


	/*
	 * Get file sizes and name string length.  Don't include
	 * the directory information yet.
	 */
	for (i = 0, slen = 0, flen = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open %s\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    ld[i].fsize = lseek(fd, 0, SEEK_END);
	    ld[i].foffset = flen;

	    slen += strlen(ld[i].fname);	/* don't add null (yet) */
	    flen += ld[i].fsize;
	    close(fd);
	}

	/* open output file */
	out = open(library_file, O_RDWR|O_TRUNC|O_BINARY|O_CREAT, FCMASK);
	if (out < 0) {
	    printf("Can't open %s for output\n", library_file);
	    xexit(EXIT_FAILURE);
	}

	/* caculate directory size */
	dir_size = 40			/* header line (see below) */
		   + ((nfiles+1)*11)	/* handling+file offset+SP+newline */
		   + slen+strlen(DLB_DIRECTORY); /* file names */

	/* write directory */
	write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);

	flen = 0L;
	/* write each file */
	for (i = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open input file '%s'\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    if (verbose) printf("%s\n",ld[i].fname);

	    fsiz = 0L;
	    while ((r = read(fd, buf, sizeof buf)) != 0) {
		if (r == -1) {
		    printf("Read Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(out, buf, r) != r) {
		    printf("Write Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		fsiz += r;
	    }
	    close(fd);
	    if (fsiz != ld[i].fsize) rewrite_directory = TRUE;
	    /* in case directory rewrite is needed */
	    ld[i].fsize = fsiz;
	    ld[i].foffset = flen;
	    flen += fsiz;
	}

	if (rewrite_directory) {
	    if (verbose) printf("(rewriting dlb directory info)\n");
	    lseek(out, 0, SEEK_SET);	/* rewind */
	    write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);
	}

	for (i = 0; i < nfiles; i++)
	    free(ld[i].fname),  ld[i].fname = 0;

	close(out);
	xexit(EXIT_SUCCESS);
	}
    }

    xexit(EXIT_SUCCESS);
    /*NOTREACHED*/
    return 0;
}